

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

int __thiscall CLineInput::OffsetFromActualToDisplay(CLineInput *this,int ActualOffset)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  CLineInput *in_RDI;
  int PrevOffset;
  int CurrentOffset;
  int DisplayOffset;
  int local_1c;
  int local_18;
  int local_4;
  
  bVar1 = IsHidden(in_RDI);
  local_4 = in_ESI;
  if (bVar1) {
    local_18 = 0;
    local_1c = 0;
    while ((local_1c < in_ESI &&
           (iVar2 = str_utf8_forward(in_RDI->m_pStr,local_1c), iVar2 != local_1c))) {
      local_18 = local_18 + 1;
      local_1c = iVar2;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int CLineInput::OffsetFromActualToDisplay(int ActualOffset) const
{
	if(!IsHidden())
		return ActualOffset;
	int DisplayOffset = 0;
	int CurrentOffset = 0;
	while(CurrentOffset < ActualOffset)
	{
		const int PrevOffset = CurrentOffset;
		CurrentOffset = str_utf8_forward(m_pStr, CurrentOffset);
		if(CurrentOffset == PrevOffset)
			break;
		DisplayOffset++;
	}
	return DisplayOffset;
}